

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::ConcurrentDatabase::prime_read_only_hashes
          (ConcurrentDatabase *this,DatabaseInterface *interface)

{
  pointer __n;
  bool bVar1;
  uint uVar2;
  reference __x;
  unsigned_long *hash;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t num_hashes;
  ResourceTag tag;
  uint i;
  DatabaseInterface *interface_local;
  ConcurrentDatabase *this_local;
  
  num_hashes._4_4_ = RESOURCE_APPLICATION_INFO;
  while( true ) {
    if ((RESOURCE_RAYTRACING_PIPELINE < num_hashes._4_4_) ||
       (uVar2 = (*interface->_vptr_DatabaseInterface[6])
                          (interface,(ulong)num_hashes._4_4_,
                           &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0),
       __n = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage, (uVar2 & 1) == 0)) {
      return;
    }
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&__range3 + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,(size_type)__n,
               (allocator_type *)((long)&__range3 + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&__range3 + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    uVar2 = (*interface->_vptr_DatabaseInterface[6])
                      (interface,(ulong)num_hashes._4_4_,
                       &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((uVar2 & 1) == 0) {
      __range3._0_4_ = 1;
    }
    else {
      __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
      hash = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&hash), bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&__end3);
        bVar1 = DatabaseInterface::test_resource_filter
                          (&this->super_DatabaseInterface,num_hashes._4_4_,*__x);
        if (bVar1) {
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::insert(this->primed_hashes + num_hashes._4_4_,__x);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end3);
      }
      __range3._0_4_ = 0;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    if ((int)__range3 != 0) break;
    num_hashes._4_4_ = num_hashes._4_4_ + RESOURCE_SAMPLER;
  }
  return;
}

Assistant:

void prime_read_only_hashes(DatabaseInterface &interface)
	{
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);
			size_t num_hashes;
			if (!interface.get_hash_list_for_resource_tag(tag, &num_hashes, nullptr))
				return;
			std::vector<Hash> hashes(num_hashes);
			if (!interface.get_hash_list_for_resource_tag(tag, &num_hashes, hashes.data()))
				return;

			for (auto &hash : hashes)
				if (test_resource_filter(tag, hash))
					primed_hashes[i].insert(hash);
		}
	}